

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_avx::forward(Cast_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _d;
  int _elempack;
  _func_int *p_Var1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  unsigned_short uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  uint uVar16;
  void *pvVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  size_t sVar26;
  uint uVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  p_Var1 = this->_vptr_Cast_x86_avx[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var1) == *(int *)(&this->field_0xd4 + (long)p_Var1)) {
    iVar12 = 0;
    if (top_blob != bottom_blob) {
      piVar2 = bottom_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = top_blob->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar2 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar2;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar12 = bottom_blob->w;
      iVar14 = bottom_blob->h;
      iVar22 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar12;
      top_blob->h = iVar14;
      top_blob->d = iVar22;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar12 = 0;
    }
  }
  else {
    iVar14 = bottom_blob->w;
    iVar22 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar16 = bottom_blob->c;
    iVar12 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    sVar26 = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var1)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var1) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx + (long)p_Var1),bottom_blob,top_blob,
                      opt);
      }
      sVar26 = sVar26 * 4;
      break;
    case 2:
    case 4:
      sVar26 = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      sVar26 = bottom_blob->elemsize;
    }
    switch(iVar12) {
    case 1:
      Mat::create(top_blob,iVar14,sVar26,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar14,iVar22,sVar26,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar14,iVar22,uVar16,sVar26,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar14,iVar22,_d,uVar16,sVar26,_elempack,opt->blob_allocator);
    }
    iVar12 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 2)) {
        iVar12 = cpu_support_x86_f16c();
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar18 = 0;
            do {
              if (0 < iVar13) {
                sVar26 = top_blob->cstep;
                sVar3 = bottom_blob->cstep;
                sVar4 = top_blob->elemsize;
                pvVar15 = top_blob->data;
                sVar5 = bottom_blob->elemsize;
                pvVar17 = bottom_blob->data;
                lVar24 = 0;
                do {
                  uVar11 = float32_to_float16(*(float *)((long)pvVar17 +
                                                        lVar24 * 4 + sVar3 * sVar5 * lVar18));
                  *(unsigned_short *)((long)pvVar15 + lVar24 * 2 + sVar26 * sVar4 * lVar18) = uVar11
                  ;
                  lVar24 = lVar24 + 1;
                } while (iVar13 != (int)lVar24);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != iVar12);
          }
        }
        else {
          cast_fp32_to_fp16_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      auVar29 = in_ZMM3._0_16_;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 2) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
        iVar12 = cpu_support_x86_f16c();
        auVar29 = in_ZMM3._0_16_;
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar18 = 0;
            do {
              if (0 < iVar13) {
                sVar26 = top_blob->cstep;
                sVar3 = bottom_blob->cstep;
                sVar4 = top_blob->elemsize;
                pvVar15 = top_blob->data;
                sVar5 = bottom_blob->elemsize;
                pvVar17 = bottom_blob->data;
                lVar24 = 0;
                do {
                  fVar28 = float16_to_float32(*(unsigned_short *)
                                               ((long)pvVar17 + lVar24 * 2 + sVar3 * sVar5 * lVar18)
                                             );
                  *(float *)((long)pvVar15 + lVar24 * 4 + sVar26 * sVar4 * lVar18) = fVar28;
                  lVar24 = lVar24 + 1;
                } while (iVar13 != (int)lVar24);
              }
              auVar29 = in_ZMM3._0_16_;
              lVar18 = lVar18 + 1;
            } while (lVar18 != iVar12);
          }
        }
        else {
          cast_fp16_to_fp32_sse_f16c(bottom_blob,top_blob,opt);
        }
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 3) &&
         (0 < (int)uVar16 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1))
      {
        uVar27 = _d * _elempack * iVar22 * iVar14;
        pvVar15 = bottom_blob->data;
        sVar26 = bottom_blob->cstep;
        pvVar17 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar20 = 0;
        do {
          if (0 < (int)uVar27) {
            uVar23 = 0;
            do {
              *(float *)((long)pvVar17 + uVar23 * 4) = (float)(int)*(char *)((long)pvVar15 + uVar23)
              ;
              uVar23 = uVar23 + 1;
            } while (uVar27 != uVar23);
          }
          uVar20 = uVar20 + 1;
          pvVar17 = (void *)((long)pvVar17 + sVar3 * sVar4);
          pvVar15 = (void *)((long)pvVar15 + sVar26 * sVar5);
        } while (uVar20 != uVar16);
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 4)) {
        iVar12 = cpu_support_x86_avx2();
        auVar10 = _DAT_00595120;
        auVar9 = _DAT_00595100;
        if (iVar12 == 0) {
          iVar12 = bottom_blob->c;
          if (0 < (long)iVar12) {
            uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar18 = 0;
            auVar30._8_8_ = 0x8000000000000000;
            auVar30._0_8_ = 0x8000000000000000;
            auVar29 = vpcmpeqd_avx(auVar29,auVar29);
            do {
              pauVar19 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar18 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar21 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar18 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar16 < 0x10) {
                uVar27 = 0;
              }
              else {
                iVar14 = 0xf;
                do {
                  auVar31 = vpsrld_avx(*pauVar19,0x10);
                  auVar32 = vpsrld_avx(pauVar19[1],0x10);
                  auVar31 = vpackusdw_avx(auVar31,auVar32);
                  auVar32 = vpsrld_avx(pauVar19[2],0x10);
                  auVar33 = vpsrld_avx(pauVar19[3],0x10);
                  auVar32 = vpackusdw_avx(auVar32,auVar33);
                  pauVar21[1] = auVar32;
                  *pauVar21 = auVar31;
                  pauVar19 = pauVar19 + 4;
                  pauVar21 = pauVar21 + 2;
                  iVar14 = iVar14 + 0x10;
                  uVar27 = uVar16 & 0xfffffff0;
                } while (iVar14 < (int)uVar16);
              }
              uVar25 = uVar27 | 7;
              while ((int)uVar25 < (int)uVar16) {
                auVar31 = vpsrld_avx(*pauVar19,0x10);
                auVar32 = vpsrld_avx(pauVar19[1],0x10);
                auVar31 = vpackusdw_avx(auVar31,auVar32);
                *pauVar21 = auVar31;
                pauVar19 = pauVar19 + 2;
                pauVar21 = pauVar21 + 1;
                uVar25 = uVar27 + 0xf;
                uVar27 = uVar27 + 8;
              }
              if ((int)uVar27 < (int)uVar16) {
                uVar20 = CONCAT44(0,~uVar27 + uVar16);
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uVar20;
                auVar33 = vpshufd_avx(auVar31,0x44);
                auVar31 = vorps_avx(auVar33,auVar30);
                auVar32 = vorps_avx(auVar33,auVar30);
                auVar33 = vorps_avx(auVar33,auVar30);
                uVar23 = 0;
                do {
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = uVar23;
                  auVar34 = vpshufd_avx(auVar34,0x44);
                  auVar36._16_16_ = auVar34;
                  auVar36._0_16_ = auVar34;
                  auVar6 = vorps_avx(auVar36,auVar9);
                  auVar36 = vorps_avx(auVar36,auVar10);
                  auVar35._0_8_ = auVar36._16_8_ ^ 0x8000000000000000;
                  auVar35._8_4_ = auVar36._24_4_;
                  auVar35._12_4_ = auVar36._28_4_ ^ 0x80000000;
                  auVar7 = vpcmpgtq_avx(auVar35,auVar31);
                  uVar8 = auVar36._0_8_;
                  auVar38._0_8_ = uVar8 ^ 0x8000000000000000;
                  auVar37._8_4_ = auVar36._8_4_;
                  auVar38._8_4_ = auVar37._8_4_;
                  uVar27 = auVar36._12_4_;
                  auVar38._12_4_ = uVar27 ^ 0x80000000;
                  auVar34 = vpcmpgtq_avx(auVar38,auVar32);
                  auVar34 = vpackssdw_avx(auVar34,auVar7);
                  auVar40._0_8_ = auVar6._16_8_ ^ 0x8000000000000000;
                  auVar40._8_4_ = auVar6._24_4_;
                  auVar40._12_4_ = auVar6._28_4_ ^ 0x80000000;
                  auVar38 = vpcmpgtq_avx(auVar40,auVar31);
                  auVar43._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar42._8_4_ = auVar6._8_4_;
                  auVar43._8_4_ = auVar42._8_4_;
                  auVar43._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar35 = vpcmpgtq_avx(auVar43,auVar33);
                  auVar35 = vpackssdw_avx(auVar35,auVar38);
                  auVar34 = vpackssdw_avx(auVar35 ^ auVar29,auVar34 ^ auVar29);
                  auVar35 = vpmovsxwd_avx(auVar34);
                  auVar40 = vpunpckhwd_avx(auVar34,auVar34);
                  auVar39._16_16_ = auVar40;
                  auVar39._0_16_ = auVar35;
                  auVar36 = vmaskmovps_avx(auVar39,*(undefined1 (*) [32])(*pauVar19 + uVar23 * 4));
                  if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2) = auVar36._2_2_;
                  }
                  auVar42._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
                  auVar42._12_4_ = auVar6._12_4_ ^ 0x80000000;
                  auVar34 = vpcmpgtq_avx(auVar42,auVar33);
                  auVar34 = vpackssdw_avx(auVar34,auVar34);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 2) = auVar36._6_2_;
                  }
                  auVar34 = vpackssdw_avx(auVar38,auVar38);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 4) = auVar36._10_2_;
                  }
                  auVar34 = vpackssdw_avx(auVar38,auVar38);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 6) = auVar36._14_2_;
                  }
                  auVar41._8_4_ = auVar37._8_4_;
                  auVar41._0_8_ = uVar8 ^ 0x8000000000000000;
                  auVar41._12_4_ = uVar27 ^ 0x80000000;
                  auVar34 = vpcmpgtq_avx(auVar41,auVar32);
                  auVar34 = vpackssdw_avx(auVar34,auVar34);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 8) = auVar36._18_2_;
                  }
                  auVar37._0_8_ = uVar8 ^ 0x8000000000000000;
                  auVar37._12_4_ = uVar27 ^ 0x80000000;
                  auVar34 = vpcmpgtq_avx(auVar37,auVar32);
                  auVar34 = vpackssdw_avx(auVar34,auVar34);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 10) = auVar36._22_2_;
                  }
                  auVar34 = vpackssdw_avx(auVar7,auVar7);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 0xc) = auVar36._26_2_;
                  }
                  auVar34 = vpackssdw_avx(auVar7,auVar7);
                  auVar34 = vpackssdw_avx(auVar34 ^ auVar29,auVar34 ^ auVar29);
                  if ((auVar34 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(short *)(*pauVar21 + uVar23 * 2 + 0xe) = auVar36._30_2_;
                  }
                  uVar23 = uVar23 + 8;
                } while ((uVar20 + 8 & 0xfffffffffffffff8) != uVar23);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != iVar12);
          }
        }
        else {
          cast_fp32_to_bf16_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
      iVar12 = 0;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx[-3]) == 4) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx[-3]) == 1)) {
        iVar14 = cpu_support_x86_avx2();
        if (iVar14 == 0) {
          iVar14 = bottom_blob->c;
          if (0 < (long)iVar14) {
            uVar16 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
            lVar18 = 0;
            auVar29 = ZEXT816(0) << 0x40;
            iVar12 = 0;
            do {
              pauVar19 = (undefined1 (*) [16])
                         (bottom_blob->cstep * lVar18 * bottom_blob->elemsize +
                         (long)bottom_blob->data);
              pauVar21 = (undefined1 (*) [16])
                         (top_blob->cstep * lVar18 * top_blob->elemsize + (long)top_blob->data);
              if ((int)uVar16 < 8) {
                uVar27 = 0;
              }
              else {
                iVar22 = 7;
                do {
                  auVar31 = vpunpcklwd_avx(auVar29,*pauVar19);
                  auVar30 = vpunpckhwd_avx(auVar29,*pauVar19);
                  pauVar21[1] = auVar30;
                  *pauVar21 = auVar31;
                  pauVar19 = pauVar19 + 1;
                  pauVar21 = pauVar21 + 2;
                  iVar22 = iVar22 + 8;
                  uVar27 = uVar16 & 0xfffffff8;
                } while (iVar22 < (int)uVar16);
              }
              uVar25 = uVar27 | 3;
              while ((int)uVar25 < (int)uVar16) {
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)*pauVar19;
                auVar30 = vpunpcklwd_avx(auVar29,auVar32);
                *pauVar21 = auVar30;
                pauVar19 = (undefined1 (*) [16])(*pauVar19 + 8);
                pauVar21 = pauVar21 + 1;
                uVar25 = uVar27 + 7;
                uVar27 = uVar27 + 4;
              }
              if (uVar16 - uVar27 != 0 && (int)uVar27 <= (int)uVar16) {
                lVar24 = 0;
                do {
                  *(uint *)(*pauVar21 + lVar24 * 4) =
                       (uint)*(ushort *)(*pauVar19 + lVar24 * 2) << 0x10;
                  lVar24 = lVar24 + 1;
                } while (uVar16 - uVar27 != (int)lVar24);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != iVar14);
          }
        }
        else {
          cast_bf16_to_fp32_sse_avx2(bottom_blob,top_blob,opt);
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int Cast_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}